

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

void * memset(void *__s,int __c,size_t __n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  ulong uVar25;
  undefined1 uVar26;
  uchar *s_;
  int iVar37;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lVar38;
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar60;
  undefined1 auVar58 [16];
  int iVar61;
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar75;
  int iVar79;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  long lVar41;
  
  auVar23 = _DAT_001020c0;
  if (__n != 0) {
    lVar24 = __n - 1;
    auVar27._8_4_ = (int)lVar24;
    auVar27._0_8_ = lVar24;
    auVar27._12_4_ = (int)((ulong)lVar24 >> 0x20);
    uVar25 = 0;
    auVar28 = auVar27;
    auVar40 = _DAT_00102040;
    auVar42 = _DAT_00102050;
    auVar43 = _DAT_00102060;
    auVar44 = _DAT_00102070;
    auVar45 = _DAT_00102080;
    auVar46 = _DAT_00102090;
    auVar47 = _DAT_001020a0;
    auVar48 = _DAT_001020b0;
    do {
      auVar58 = auVar27 ^ auVar23;
      auVar62 = auVar48 ^ auVar23;
      iVar37 = auVar58._0_4_;
      iVar75 = -(uint)(iVar37 < auVar62._0_4_);
      iVar39 = auVar58._4_4_;
      auVar64._4_4_ = -(uint)(iVar39 < auVar62._4_4_);
      iVar60 = auVar58._8_4_;
      iVar79 = -(uint)(iVar60 < auVar62._8_4_);
      iVar61 = auVar58._12_4_;
      auVar64._12_4_ = -(uint)(iVar61 < auVar62._12_4_);
      auVar58._4_4_ = iVar75;
      auVar58._0_4_ = iVar75;
      auVar58._8_4_ = iVar79;
      auVar58._12_4_ = iVar79;
      auVar58 = pshuflw(auVar28,auVar58,0xe8);
      auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar39);
      auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar61);
      auVar63._0_4_ = auVar63._4_4_;
      auVar63._8_4_ = auVar63._12_4_;
      auVar49 = pshuflw(in_XMM11,auVar63,0xe8);
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar62 = pshuflw(auVar58,auVar64,0xe8);
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      auVar28 = (auVar62 | auVar49 & auVar58) ^ auVar28;
      auVar28 = packssdw(auVar28,auVar28);
      uVar26 = (undefined1)__c;
      if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar25) = uVar26;
      }
      auVar49._4_4_ = iVar75;
      auVar49._0_4_ = iVar75;
      auVar49._8_4_ = iVar79;
      auVar49._12_4_ = iVar79;
      auVar64 = auVar63 & auVar49 | auVar64;
      auVar28 = packssdw(auVar64,auVar64);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28 ^ auVar62,auVar28 ^ auVar62);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 1) = uVar26;
      }
      auVar28 = auVar47 ^ auVar23;
      auVar50._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
      auVar50._4_4_ = -(uint)(iVar39 < auVar28._4_4_);
      auVar50._8_4_ = -(uint)(iVar60 < auVar28._8_4_);
      auVar50._12_4_ = -(uint)(iVar61 < auVar28._12_4_);
      auVar65._4_4_ = auVar50._0_4_;
      auVar65._0_4_ = auVar50._0_4_;
      auVar65._8_4_ = auVar50._8_4_;
      auVar65._12_4_ = auVar50._8_4_;
      iVar75 = -(uint)(auVar28._4_4_ == iVar39);
      iVar79 = -(uint)(auVar28._12_4_ == iVar61);
      auVar10._4_4_ = iVar75;
      auVar10._0_4_ = iVar75;
      auVar10._8_4_ = iVar79;
      auVar10._12_4_ = iVar79;
      auVar76._4_4_ = auVar50._4_4_;
      auVar76._0_4_ = auVar50._4_4_;
      auVar76._8_4_ = auVar50._12_4_;
      auVar76._12_4_ = auVar50._12_4_;
      auVar28 = auVar10 & auVar65 | auVar76;
      auVar28 = packssdw(auVar28,auVar28);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28 ^ auVar1,auVar28 ^ auVar1);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 2) = uVar26;
      }
      auVar28 = pshufhw(auVar28,auVar65,0x84);
      auVar11._4_4_ = iVar75;
      auVar11._0_4_ = iVar75;
      auVar11._8_4_ = iVar79;
      auVar11._12_4_ = iVar79;
      auVar62 = pshufhw(auVar50,auVar11,0x84);
      auVar58 = pshufhw(auVar28,auVar76,0x84);
      auVar29._8_4_ = 0xffffffff;
      auVar29._0_8_ = 0xffffffffffffffff;
      auVar29._12_4_ = 0xffffffff;
      auVar29 = (auVar58 | auVar62 & auVar28) ^ auVar29;
      auVar28 = packssdw(auVar29,auVar29);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 3) = uVar26;
      }
      auVar28 = auVar46 ^ auVar23;
      auVar51._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
      auVar51._4_4_ = -(uint)(iVar39 < auVar28._4_4_);
      auVar51._8_4_ = -(uint)(iVar60 < auVar28._8_4_);
      auVar51._12_4_ = -(uint)(iVar61 < auVar28._12_4_);
      auVar12._4_4_ = auVar51._0_4_;
      auVar12._0_4_ = auVar51._0_4_;
      auVar12._8_4_ = auVar51._8_4_;
      auVar12._12_4_ = auVar51._8_4_;
      auVar62 = pshuflw(auVar76,auVar12,0xe8);
      auVar30._0_4_ = -(uint)(auVar28._0_4_ == iVar37);
      auVar30._4_4_ = -(uint)(auVar28._4_4_ == iVar39);
      auVar30._8_4_ = -(uint)(auVar28._8_4_ == iVar60);
      auVar30._12_4_ = -(uint)(auVar28._12_4_ == iVar61);
      auVar66._4_4_ = auVar30._4_4_;
      auVar66._0_4_ = auVar30._4_4_;
      auVar66._8_4_ = auVar30._12_4_;
      auVar66._12_4_ = auVar30._12_4_;
      auVar28 = pshuflw(auVar30,auVar66,0xe8);
      auVar67._4_4_ = auVar51._4_4_;
      auVar67._0_4_ = auVar51._4_4_;
      auVar67._8_4_ = auVar51._12_4_;
      auVar67._12_4_ = auVar51._12_4_;
      auVar58 = pshuflw(auVar51,auVar67,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28 & auVar62,(auVar58 | auVar28 & auVar62) ^ auVar2);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar25 + 4) = uVar26;
      }
      auVar13._4_4_ = auVar51._0_4_;
      auVar13._0_4_ = auVar51._0_4_;
      auVar13._8_4_ = auVar51._8_4_;
      auVar13._12_4_ = auVar51._8_4_;
      auVar67 = auVar66 & auVar13 | auVar67;
      auVar58 = packssdw(auVar67,auVar67);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28,auVar58 ^ auVar3);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 5) = uVar26;
      }
      auVar28 = auVar45 ^ auVar23;
      auVar52._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
      auVar52._4_4_ = -(uint)(iVar39 < auVar28._4_4_);
      auVar52._8_4_ = -(uint)(iVar60 < auVar28._8_4_);
      auVar52._12_4_ = -(uint)(iVar61 < auVar28._12_4_);
      auVar68._4_4_ = auVar52._0_4_;
      auVar68._0_4_ = auVar52._0_4_;
      auVar68._8_4_ = auVar52._8_4_;
      auVar68._12_4_ = auVar52._8_4_;
      iVar75 = -(uint)(auVar28._4_4_ == iVar39);
      iVar79 = -(uint)(auVar28._12_4_ == iVar61);
      auVar14._4_4_ = iVar75;
      auVar14._0_4_ = iVar75;
      auVar14._8_4_ = iVar79;
      auVar14._12_4_ = iVar79;
      auVar77._4_4_ = auVar52._4_4_;
      auVar77._0_4_ = auVar52._4_4_;
      auVar77._8_4_ = auVar52._12_4_;
      auVar77._12_4_ = auVar52._12_4_;
      auVar28 = auVar14 & auVar68 | auVar77;
      auVar28 = packssdw(auVar28,auVar28);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28 ^ auVar4,auVar28 ^ auVar4);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar25 + 6) = uVar26;
      }
      auVar28 = pshufhw(auVar28,auVar68,0x84);
      auVar15._4_4_ = iVar75;
      auVar15._0_4_ = iVar75;
      auVar15._8_4_ = iVar79;
      auVar15._12_4_ = iVar79;
      auVar62 = pshufhw(auVar52,auVar15,0x84);
      auVar58 = pshufhw(auVar28,auVar77,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar58 | auVar62 & auVar28) ^ auVar31;
      auVar28 = packssdw(auVar31,auVar31);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 7) = uVar26;
      }
      auVar28 = auVar44 ^ auVar23;
      auVar53._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
      auVar53._4_4_ = -(uint)(iVar39 < auVar28._4_4_);
      auVar53._8_4_ = -(uint)(iVar60 < auVar28._8_4_);
      auVar53._12_4_ = -(uint)(iVar61 < auVar28._12_4_);
      auVar16._4_4_ = auVar53._0_4_;
      auVar16._0_4_ = auVar53._0_4_;
      auVar16._8_4_ = auVar53._8_4_;
      auVar16._12_4_ = auVar53._8_4_;
      auVar62 = pshuflw(auVar77,auVar16,0xe8);
      auVar32._0_4_ = -(uint)(auVar28._0_4_ == iVar37);
      auVar32._4_4_ = -(uint)(auVar28._4_4_ == iVar39);
      auVar32._8_4_ = -(uint)(auVar28._8_4_ == iVar60);
      auVar32._12_4_ = -(uint)(auVar28._12_4_ == iVar61);
      auVar69._4_4_ = auVar32._4_4_;
      auVar69._0_4_ = auVar32._4_4_;
      auVar69._8_4_ = auVar32._12_4_;
      auVar69._12_4_ = auVar32._12_4_;
      auVar28 = pshuflw(auVar32,auVar69,0xe8);
      auVar70._4_4_ = auVar53._4_4_;
      auVar70._0_4_ = auVar53._4_4_;
      auVar70._8_4_ = auVar53._12_4_;
      auVar70._12_4_ = auVar53._12_4_;
      auVar58 = pshuflw(auVar53,auVar70,0xe8);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar58 | auVar28 & auVar62) ^ auVar54;
      auVar58 = packssdw(auVar54,auVar54);
      auVar28 = packsswb(auVar28 & auVar62,auVar58);
      if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar25 + 8) = uVar26;
      }
      auVar17._4_4_ = auVar53._0_4_;
      auVar17._0_4_ = auVar53._0_4_;
      auVar17._8_4_ = auVar53._8_4_;
      auVar17._12_4_ = auVar53._8_4_;
      auVar70 = auVar69 & auVar17 | auVar70;
      auVar58 = packssdw(auVar70,auVar70);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar5,auVar58 ^ auVar5);
      auVar28 = packsswb(auVar28,auVar58);
      if ((auVar28._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 9) = uVar26;
      }
      auVar28 = auVar43 ^ auVar23;
      auVar55._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
      auVar55._4_4_ = -(uint)(iVar39 < auVar28._4_4_);
      auVar55._8_4_ = -(uint)(iVar60 < auVar28._8_4_);
      auVar55._12_4_ = -(uint)(iVar61 < auVar28._12_4_);
      auVar71._4_4_ = auVar55._0_4_;
      auVar71._0_4_ = auVar55._0_4_;
      auVar71._8_4_ = auVar55._8_4_;
      auVar71._12_4_ = auVar55._8_4_;
      iVar75 = -(uint)(auVar28._4_4_ == iVar39);
      iVar79 = -(uint)(auVar28._12_4_ == iVar61);
      auVar18._4_4_ = iVar75;
      auVar18._0_4_ = iVar75;
      auVar18._8_4_ = iVar79;
      auVar18._12_4_ = iVar79;
      auVar78._4_4_ = auVar55._4_4_;
      auVar78._0_4_ = auVar55._4_4_;
      auVar78._8_4_ = auVar55._12_4_;
      auVar78._12_4_ = auVar55._12_4_;
      auVar28 = auVar18 & auVar71 | auVar78;
      auVar28 = packssdw(auVar28,auVar28);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28 ^ auVar6,auVar28 ^ auVar6);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar25 + 10) = uVar26;
      }
      auVar28 = pshufhw(auVar28,auVar71,0x84);
      auVar19._4_4_ = iVar75;
      auVar19._0_4_ = iVar75;
      auVar19._8_4_ = iVar79;
      auVar19._12_4_ = iVar79;
      auVar62 = pshufhw(auVar55,auVar19,0x84);
      auVar58 = pshufhw(auVar28,auVar78,0x84);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = (auVar58 | auVar62 & auVar28) ^ auVar33;
      auVar28 = packssdw(auVar33,auVar33);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 0xb) = uVar26;
      }
      auVar28 = auVar42 ^ auVar23;
      auVar56._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
      auVar56._4_4_ = -(uint)(iVar39 < auVar28._4_4_);
      auVar56._8_4_ = -(uint)(iVar60 < auVar28._8_4_);
      auVar56._12_4_ = -(uint)(iVar61 < auVar28._12_4_);
      auVar20._4_4_ = auVar56._0_4_;
      auVar20._0_4_ = auVar56._0_4_;
      auVar20._8_4_ = auVar56._8_4_;
      auVar20._12_4_ = auVar56._8_4_;
      auVar62 = pshuflw(auVar78,auVar20,0xe8);
      auVar34._0_4_ = -(uint)(auVar28._0_4_ == iVar37);
      auVar34._4_4_ = -(uint)(auVar28._4_4_ == iVar39);
      auVar34._8_4_ = -(uint)(auVar28._8_4_ == iVar60);
      auVar34._12_4_ = -(uint)(auVar28._12_4_ == iVar61);
      auVar72._4_4_ = auVar34._4_4_;
      auVar72._0_4_ = auVar34._4_4_;
      auVar72._8_4_ = auVar34._12_4_;
      auVar72._12_4_ = auVar34._12_4_;
      auVar28 = pshuflw(auVar34,auVar72,0xe8);
      auVar73._4_4_ = auVar56._4_4_;
      auVar73._0_4_ = auVar56._4_4_;
      auVar73._8_4_ = auVar56._12_4_;
      auVar73._12_4_ = auVar56._12_4_;
      auVar58 = pshuflw(auVar56,auVar73,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28 & auVar62,(auVar58 | auVar28 & auVar62) ^ auVar7);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar25 + 0xc) = uVar26;
      }
      auVar21._4_4_ = auVar56._0_4_;
      auVar21._0_4_ = auVar56._0_4_;
      auVar21._8_4_ = auVar56._8_4_;
      auVar21._12_4_ = auVar56._8_4_;
      auVar73 = auVar72 & auVar21 | auVar73;
      auVar58 = packssdw(auVar73,auVar73);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28,auVar58 ^ auVar8);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 0xd) = uVar26;
      }
      auVar28 = auVar40 ^ auVar23;
      auVar57._0_4_ = -(uint)(iVar37 < auVar28._0_4_);
      auVar57._4_4_ = -(uint)(iVar39 < auVar28._4_4_);
      auVar57._8_4_ = -(uint)(iVar60 < auVar28._8_4_);
      auVar57._12_4_ = -(uint)(iVar61 < auVar28._12_4_);
      auVar74._4_4_ = auVar57._0_4_;
      auVar74._0_4_ = auVar57._0_4_;
      auVar74._8_4_ = auVar57._8_4_;
      auVar74._12_4_ = auVar57._8_4_;
      iVar37 = -(uint)(auVar28._4_4_ == iVar39);
      iVar39 = -(uint)(auVar28._12_4_ == iVar61);
      auVar59._4_4_ = iVar37;
      auVar59._0_4_ = iVar37;
      auVar59._8_4_ = iVar39;
      auVar59._12_4_ = iVar39;
      auVar35._4_4_ = auVar57._4_4_;
      auVar35._0_4_ = auVar57._4_4_;
      auVar35._8_4_ = auVar57._12_4_;
      auVar35._12_4_ = auVar57._12_4_;
      auVar35 = auVar59 & auVar74 | auVar35;
      auVar28 = packssdw(auVar35,auVar35);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar28 = packssdw(auVar28 ^ auVar9,auVar28 ^ auVar9);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)__s + uVar25 + 0xe) = uVar26;
      }
      auVar28 = pshufhw(auVar28,auVar74,0x84);
      auVar58 = pshufhw(auVar57,auVar59,0x84);
      in_XMM11 = auVar58 & auVar28;
      auVar22._4_4_ = auVar57._4_4_;
      auVar22._0_4_ = auVar57._4_4_;
      auVar22._8_4_ = auVar57._12_4_;
      auVar22._12_4_ = auVar57._12_4_;
      auVar28 = pshufhw(auVar28,auVar22,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar28 | in_XMM11) ^ auVar36;
      auVar28 = packssdw(auVar36,auVar36);
      auVar28 = packsswb(auVar28,auVar28);
      if ((auVar28._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)__s + uVar25 + 0xf) = uVar26;
      }
      uVar25 = uVar25 + 0x10;
      lVar24 = (long)DAT_001020d0;
      lVar41 = auVar48._8_8_;
      auVar48._0_8_ = auVar48._0_8_ + lVar24;
      lVar38 = DAT_001020d0._8_8_;
      auVar48._8_8_ = lVar41 + lVar38;
      lVar41 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + lVar24;
      auVar47._8_8_ = lVar41 + lVar38;
      lVar41 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + lVar24;
      auVar46._8_8_ = lVar41 + lVar38;
      lVar41 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + lVar24;
      auVar45._8_8_ = lVar41 + lVar38;
      lVar41 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + lVar24;
      auVar44._8_8_ = lVar41 + lVar38;
      lVar41 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + lVar24;
      auVar43._8_8_ = lVar41 + lVar38;
      lVar41 = auVar42._8_8_;
      auVar42._0_8_ = auVar42._0_8_ + lVar24;
      auVar42._8_8_ = lVar41 + lVar38;
      lVar41 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + lVar24;
      auVar40._8_8_ = lVar41 + lVar38;
      auVar28 = _DAT_001020d0;
    } while ((__n + 0xf & 0xfffffffffffffff0) != uVar25);
  }
  return __s;
}

Assistant:

void *memset(void *s, int c, size_t n) {
    unsigned char *s_ = s;
    const unsigned char c_ = (unsigned char)c;
    for (size_t i = 0; i < n; ++i) {
        s_[i] = c_;
    }
    return s;
}